

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IndexSpaceI.H
# Opt level: O1

void __thiscall
amrex::EB2::
IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
::IndexSpaceImp(IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
                *this,GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
                      *gshop,Geometry *geom,int required_coarsening_level,int max_coarsening_level,
               int ngrow,bool build_coarse_level_by_coarsening,bool extend_domain_face,
               int num_coarsen_opt)

{
  Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  *this_00;
  pointer *ppGVar1;
  pointer *ppBVar2;
  Real *pRVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  pointer pGVar7;
  pointer pGVar8;
  Real RVar9;
  undefined8 uVar10;
  Real RVar11;
  Real RVar12;
  Real RVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar16;
  long lVar17;
  Geometry *__args_2;
  bool bVar18;
  int iVar19;
  long *plVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  Real *pRVar24;
  size_type *psVar25;
  uint uVar26;
  long lVar27;
  Level *this_01;
  uint uVar28;
  int iVar29;
  uint uVar30;
  bool extend_domain_face_local;
  uint local_1a8;
  int ng;
  int local_1a0;
  int local_19c;
  Box cdomain;
  string __str;
  long *local_128 [2];
  long local_118 [2];
  gpu_tuple_element<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>_> *local_108;
  Geometry *local_100;
  Geometry cgeom;
  
  extend_domain_face_local = extend_domain_face;
  (this->super_IndexSpace)._vptr_IndexSpace = (_func_int **)&PTR__IndexSpaceImp_0074f128;
  RVar9 = (gshop->m_f).
          super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
          super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
          .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
          super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value.m_height;
  uVar10 = *(undefined8 *)
            &(gshop->m_f).
             super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
             super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
             .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
             super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value.m_direction;
  RVar11 = (gshop->m_f).
           super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
           super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
           .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
           super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value.m_center.x;
  RVar12 = *(Real *)((long)&(gshop->m_f).
                            super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                            .
                            super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                            .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
                            super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value.m_center +
                    8);
  RVar13 = *(Real *)((long)&(gshop->m_f).
                            super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                            .
                            super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                            .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
                            super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value.m_center +
                    0x10);
  (this->m_gshop).m_f.
  super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
  super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
  super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
  super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value.m_radius =
       (gshop->m_f).
       super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
       super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
       super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
       super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value.m_radius;
  *(Real *)((long)&(this->m_gshop).m_f.
                   super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                   .
                   super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                   .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
                   super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value + 8) = RVar9;
  *(undefined8 *)
   ((long)&(this->m_gshop).m_f.
           super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
           super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
           .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
           super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value + 0x10) = uVar10;
  ((XDim3 *)
  ((long)&(this->m_gshop).m_f.
          super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
          super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
          .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
          super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value + 0x18))->x = RVar11;
  *(Real *)((long)&(this->m_gshop).m_f.
                   super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                   .
                   super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                   .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
                   super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value + 0x20) = RVar12;
  *(Real *)((long)&(this->m_gshop).m_f.
                   super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                   .
                   super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                   .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
                   super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value + 0x28) = RVar13;
  *(Real *)((long)&(this->m_gshop).m_f.
                   super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                   .
                   super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                   .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
                   super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value + 0x30) =
       (gshop->m_f).
       super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
       super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
       super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
       super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value.m_sign;
  local_108 = &(this->m_gshop).m_f.
               super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
               super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
               .super_gpu_tuple_element<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>_>;
  local_100 = geom;
  std::vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>::vector
            ((vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_> *)
             local_108,
             (vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_> *)
             &(gshop->m_f).
              super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
              super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
              .super_gpu_tuple_element<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>_>);
  (this->m_gshop).m_resource = gshop->m_resource;
  this->m_build_coarse_level_by_coarsening = build_coarse_level_by_coarsening;
  this->m_extend_domain_face = extend_domain_face_local;
  this->m_num_coarsen_opt = num_coarsen_opt;
  this_00 = &this->m_gslevel;
  (this->m_gslevel).
  super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  .
  super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_gslevel).
  super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  .
  super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_gslevel).
  super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  .
  super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  local_19c = required_coarsening_level;
  if (0x1e < (uint)required_coarsening_level) {
    Assert_host("required_coarsening_level >= 0 && required_coarsening_level <= 30",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2_IndexSpaceI.H"
                ,0xe,(char *)0x0);
  }
  __args_2 = local_100;
  iVar29 = local_19c;
  if (max_coarsening_level < local_19c) {
    max_coarsening_level = local_19c;
  }
  iVar19 = 0x1e;
  if (max_coarsening_level < 0x1e) {
    iVar19 = max_coarsening_level;
  }
  local_1a0 = 0;
  if (0 < ngrow) {
    local_1a0 = ngrow;
  }
  iVar21 = local_19c;
  if (0 < local_19c) {
    do {
      local_1a0 = local_1a0 * 2;
      iVar21 = iVar21 + -1;
    } while (iVar21 != 0);
  }
  iVar4._M_current =
       (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
    _M_realloc_insert<amrex::Geometry_const&>
              ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)&this->m_geom,iVar4,
               local_100);
  }
  else {
    memcpy(iVar4._M_current,local_100,200);
    ppGVar1 = &(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  iVar5._M_current =
       (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar5._M_current ==
      (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
              ((vector<amrex::Box,std::allocator<amrex::Box>> *)&this->m_domain,iVar5,
               &__args_2->domain);
  }
  else {
    uVar10 = *(undefined8 *)(__args_2->domain).smallend.vect;
    uVar14 = *(undefined8 *)((__args_2->domain).smallend.vect + 2);
    uVar15 = *(undefined8 *)((__args_2->domain).bigend.vect + 2);
    *(undefined8 *)((iVar5._M_current)->bigend).vect = *(undefined8 *)(__args_2->domain).bigend.vect
    ;
    *(undefined8 *)(((iVar5._M_current)->bigend).vect + 2) = uVar15;
    *(undefined8 *)((iVar5._M_current)->smallend).vect = uVar10;
    *(undefined8 *)(((iVar5._M_current)->smallend).vect + 2) = uVar14;
    ppBVar2 = &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppBVar2 = *ppBVar2 + 1;
  }
  iVar6._M_current =
       (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->m_ngrow,iVar6,&local_1a0);
  }
  else {
    *iVar6._M_current = local_1a0;
    (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         iVar6._M_current + 1;
  }
  std::
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  ::reserve(&this_00->
             super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
            ,(long)(iVar19 + 1));
  cgeom.super_CoordSys._0_8_ = this;
  std::
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>>>
  ::
  emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>*,amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>const&,amrex::Geometry_const&,int&,int&,bool&,int&>
            ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>>>
              *)this_00,
             (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
              **)&cgeom,gshop,__args_2,&EB2::max_grid_size,&local_1a0,&extend_domain_face_local,
             &num_coarsen_opt);
  local_1a8 = 1;
  if (0 < max_coarsening_level) {
    do {
      cgeom.super_CoordSys.c_sys = SPHERICAL;
      cgeom.super_CoordSys._4_4_ = 2;
      cgeom.super_CoordSys.offset[0] = (Real)CONCAT44(cgeom.super_CoordSys.offset[0]._4_4_,2);
      __str._M_dataplus._M_p = (pointer)0x200000002;
      __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,2);
      bVar18 = Box::coarsenable(&(this->m_geom).
                                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1].domain,
                                (IntVect *)&cgeom,(IntVect *)&__str);
      if (!bVar18) {
        if (iVar29 < (int)local_1a8) {
          return;
        }
        uVar22 = -local_1a8;
        if (0 < (int)local_1a8) {
          uVar22 = local_1a8;
        }
        uVar30 = 1;
        if (9 < uVar22) {
          uVar23 = (ulong)uVar22;
          uVar28 = 4;
          do {
            uVar30 = uVar28;
            uVar26 = (uint)uVar23;
            if (uVar26 < 100) {
              uVar30 = uVar30 - 2;
              goto LAB_0023d696;
            }
            if (uVar26 < 1000) {
              uVar30 = uVar30 - 1;
              goto LAB_0023d696;
            }
            if (uVar26 < 10000) goto LAB_0023d696;
            uVar23 = uVar23 / 10000;
            uVar28 = uVar30 + 4;
          } while (99999 < uVar26);
          uVar30 = uVar30 + 1;
        }
LAB_0023d696:
        uVar28 = local_1a8 >> 0x1f;
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&__str,(char)uVar30 - (char)((int)local_1a8 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (__str._M_dataplus._M_p + uVar28,uVar30,uVar22);
        plVar20 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x69ff55);
        iVar29 = local_19c;
        pRVar3 = cgeom.super_CoordSys.offset + 1;
        pRVar24 = (Real *)(plVar20 + 2);
        if ((Real *)*plVar20 == pRVar24) {
          cgeom.super_CoordSys.offset[1] = *pRVar24;
          cgeom.super_CoordSys.offset[2] = (Real)plVar20[3];
          cgeom.super_CoordSys._0_8_ = pRVar3;
        }
        else {
          cgeom.super_CoordSys.offset[1] = *pRVar24;
          cgeom.super_CoordSys._0_8_ = (Real *)*plVar20;
        }
        cgeom.super_CoordSys.offset[0] = (Real)plVar20[1];
        *plVar20 = (long)pRVar24;
        plVar20[1] = 0;
        *(undefined1 *)(plVar20 + 2) = 0;
        Abort((string *)&cgeom);
        if ((Real *)cgeom.super_CoordSys._0_8_ != pRVar3) {
          operator_delete((void *)cgeom.super_CoordSys._0_8_,
                          (long)cgeom.super_CoordSys.offset[1] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
      }
      ng = 0;
      if ((int)local_1a8 <= iVar29) {
        ng = (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             [-1] / 2;
      }
      pGVar7 = (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar27 = *(long *)pGVar7[-1].domain.smallend.vect;
      lVar16 = *(long *)(pGVar7[-1].domain.smallend.vect + 2);
      lVar17 = *(long *)pGVar7[-1].domain.bigend.vect;
      uVar10 = *(undefined8 *)(pGVar7[-1].domain.bigend.vect + 2);
      cdomain.bigend.vect[1] = (int)((ulong)lVar17 >> 0x20);
      cdomain.bigend.vect[2] = (int)uVar10;
      cdomain.btype.itype = SUB84(uVar10,4);
      cdomain.smallend.vect[2] = (int)lVar16;
      cdomain.bigend.vect[0] = (int)((ulong)lVar16 >> 0x20);
      __str._M_dataplus._M_p = (pointer)0x200000002;
      __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,2);
      cdomain.smallend.vect[0] = (int)lVar27;
      if (cdomain.smallend.vect[0] < 0) {
        uVar30 = cdomain.smallend.vect[0] + 1;
        uVar22 = -uVar30;
        if (0 < (int)uVar30) {
          uVar22 = uVar30;
        }
        cdomain.smallend.vect[0] = ~(uVar22 >> 1);
      }
      else {
        cdomain.smallend.vect[0] = (uint)cdomain.smallend.vect[0] >> 1;
      }
      cdomain.smallend.vect[1] = (int)((ulong)lVar27 >> 0x20);
      if (lVar27 < 0) {
        uVar30 = cdomain.smallend.vect[1] + 1;
        uVar22 = -uVar30;
        if (0 < (int)uVar30) {
          uVar22 = uVar30;
        }
        cdomain.smallend.vect[1] = ~(uVar22 >> 1);
      }
      else {
        cdomain.smallend.vect[1] = (uint)cdomain.smallend.vect[1] >> 1;
      }
      if (cdomain.smallend.vect[2] < 0) {
        uVar30 = cdomain.smallend.vect[2] + 1;
        uVar22 = -uVar30;
        if (0 < (int)uVar30) {
          uVar22 = uVar30;
        }
        cdomain.smallend.vect[2] = ~(uVar22 >> 1);
      }
      else {
        cdomain.smallend.vect[2] = (uint)cdomain.smallend.vect[2] >> 1;
      }
      cdomain.btype.itype = SUB84(uVar10,4);
      cdomain.bigend.vect[2] = (int)uVar10;
      if (cdomain.btype.itype == 0) {
        if (lVar16 < 0) {
          uVar30 = cdomain.bigend.vect[0] + 1;
          uVar22 = -uVar30;
          if (0 < (int)uVar30) {
            uVar22 = uVar30;
          }
          cdomain.bigend.vect[0] = ~(uVar22 >> 1);
        }
        else {
          cdomain.bigend.vect[0] = (uint)cdomain.bigend.vect[0] >> 1;
        }
        if (lVar17 < 0) {
          uVar30 = cdomain.bigend.vect[1] + 1;
          uVar22 = -uVar30;
          if (0 < (int)uVar30) {
            uVar22 = uVar30;
          }
          cdomain.bigend.vect[1] = ~(uVar22 >> 1);
        }
        else {
          cdomain.bigend.vect[1] = (uint)cdomain.bigend.vect[1] >> 1;
        }
        if (cdomain.bigend.vect[2] < 0) {
          uVar30 = cdomain.bigend.vect[2] + 1;
          uVar22 = -uVar30;
          if (0 < (int)uVar30) {
            uVar22 = uVar30;
          }
          cdomain.bigend.vect[2] = ~(uVar22 >> 1);
        }
        else {
          cdomain.bigend.vect[2] = (uint)cdomain.bigend.vect[2] >> 1;
        }
      }
      else {
        cgeom.super_CoordSys.c_sys = cartesian;
        cgeom.super_CoordSys._4_4_ = 0;
        cgeom.super_CoordSys.offset[0] =
             (Real)((ulong)cgeom.super_CoordSys.offset[0] & 0xffffffff00000000);
        lVar27 = 0;
        do {
          if (((cdomain.btype.itype >> ((uint)lVar27 & 0x1f) & 1) != 0) &&
             (cdomain.bigend.vect[lVar27] % *(int *)((long)&__str._M_dataplus._M_p + lVar27 * 4) !=
              0)) {
            *(undefined4 *)((long)cgeom.super_CoordSys.offset + lVar27 * 4 + -8) = 1;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 3);
        if (lVar16 < 0) {
          uVar30 = cdomain.bigend.vect[0] + 1;
          uVar22 = -uVar30;
          if (0 < (int)uVar30) {
            uVar22 = uVar30;
          }
          uVar22 = ~(uVar22 >> 1);
        }
        else {
          uVar22 = (uint)cdomain.bigend.vect[0] >> 1;
        }
        if (lVar17 < 0) {
          uVar28 = cdomain.bigend.vect[1] + 1;
          uVar30 = -uVar28;
          if (0 < (int)uVar28) {
            uVar30 = uVar28;
          }
          uVar30 = ~(uVar30 >> 1);
        }
        else {
          uVar30 = (uint)cdomain.bigend.vect[1] >> 1;
        }
        if (cdomain.bigend.vect[2] < 0) {
          uVar26 = cdomain.bigend.vect[2] + 1;
          uVar28 = -uVar26;
          if (0 < (int)uVar26) {
            uVar28 = uVar26;
          }
          uVar28 = ~(uVar28 >> 1);
        }
        else {
          uVar28 = (uint)cdomain.bigend.vect[2] >> 1;
        }
        cdomain.bigend.vect[0] = uVar22 + cgeom.super_CoordSys.c_sys;
        cdomain.bigend.vect[1] = uVar30 + cgeom.super_CoordSys._4_4_;
        cdomain.bigend.vect[2] = uVar28 + cgeom.super_CoordSys.offset[0]._0_4_;
      }
      __str._M_dataplus._M_p = (pointer)0x200000002;
      __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,2);
      memcpy(&cgeom,pGVar7 + -1,200);
      Geometry::coarsen(&cgeom,(IntVect *)&__str);
      __str._M_dataplus._M_p = (pointer)this;
      std::
      vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>>>
      ::
      emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>*,int&,int&,int&,amrex::Geometry&,amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>&>
                ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>>>
                  *)this_00,
                 (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
                  **)&__str,(int *)&local_1a8,&EB2::max_grid_size,&ng,&cgeom,
                 (this->m_gslevel).
                 super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
                 .
                 super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)(int)local_1a8 + -1);
      pGVar8 = (this->m_gslevel).
               super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
               .
               super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pGVar8[-1].super_Level.m_ok == false) {
        this_01 = &pGVar8[-1].super_Level;
        (this->m_gslevel).
        super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
        .
        super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)this_01;
        Level::~Level(this_01);
        if (iVar29 < (int)local_1a8) {
          return;
        }
        if (build_coarse_level_by_coarsening) {
          uVar22 = -local_1a8;
          if (0 < (int)local_1a8) {
            uVar22 = local_1a8;
          }
          uVar30 = 1;
          if (9 < uVar22) {
            uVar23 = (ulong)uVar22;
            uVar28 = 4;
            do {
              uVar30 = uVar28;
              uVar26 = (uint)uVar23;
              if (uVar26 < 100) {
                uVar30 = uVar30 - 2;
                goto LAB_0023dab0;
              }
              if (uVar26 < 1000) {
                uVar30 = uVar30 - 1;
                goto LAB_0023dab0;
              }
              if (uVar26 < 10000) goto LAB_0023dab0;
              uVar23 = uVar23 / 10000;
              uVar28 = uVar30 + 4;
            } while (99999 < uVar26);
            uVar30 = uVar30 + 1;
          }
LAB_0023dab0:
          uVar28 = local_1a8 >> 0x1f;
          local_128[0] = local_118;
          std::__cxx11::string::_M_construct
                    ((ulong)local_128,(char)uVar30 - (char)((int)local_1a8 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)uVar28 + (long)local_128[0]),uVar30,uVar22);
          plVar20 = (long *)std::__cxx11::string::replace((ulong)local_128,0,(char *)0x0,0x69ff88);
          iVar29 = local_19c;
          psVar25 = (size_type *)(plVar20 + 2);
          if ((size_type *)*plVar20 == psVar25) {
            __str.field_2._M_allocated_capacity = *psVar25;
            __str.field_2._8_8_ = plVar20[3];
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
          }
          else {
            __str.field_2._M_allocated_capacity = *psVar25;
            __str._M_dataplus._M_p = (pointer)*plVar20;
          }
          __str._M_string_length = plVar20[1];
          *plVar20 = (long)psVar25;
          plVar20[1] = 0;
          *(undefined1 *)(plVar20 + 2) = 0;
          Abort(&__str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          if (local_128[0] != local_118) {
            operator_delete(local_128[0],local_118[0] + 1);
          }
        }
        else {
          local_128[0] = (long *)CONCAT44(local_128[0]._4_4_,num_coarsen_opt - local_1a8);
          __str._M_dataplus._M_p = (pointer)this;
          std::
          vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>>>
          ::
          emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>*,amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>const&,amrex::Geometry&,int&,int&,bool&,int>
                    ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>>>
                      *)this_00,
                     (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
                      **)&__str,gshop,&cgeom,&EB2::max_grid_size,&ng,&extend_domain_face_local,
                     (int *)local_128);
        }
      }
      iVar4._M_current =
           (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
        _M_realloc_insert<amrex::Geometry_const&>
                  ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)&this->m_geom,iVar4,
                   &cgeom);
      }
      else {
        memcpy(iVar4._M_current,&cgeom,200);
        ppGVar1 = &(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppGVar1 = *ppGVar1 + 1;
      }
      iVar5._M_current =
           (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                  ((vector<amrex::Box,std::allocator<amrex::Box>> *)&this->m_domain,iVar5,&cdomain);
      }
      else {
        *(ulong *)((iVar5._M_current)->bigend).vect =
             CONCAT44(cdomain.bigend.vect[1],cdomain.bigend.vect[0]);
        *(undefined8 *)(((iVar5._M_current)->bigend).vect + 2) = cdomain._20_8_;
        *(undefined8 *)((iVar5._M_current)->smallend).vect = cdomain.smallend.vect._0_8_;
        *(ulong *)(((iVar5._M_current)->smallend).vect + 2) =
             CONCAT44(cdomain.bigend.vect[0],cdomain.smallend.vect[2]);
        ppBVar2 = &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppBVar2 = *ppBVar2 + 1;
      }
      iVar6._M_current =
           (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->m_ngrow,iVar6,&ng);
      }
      else {
        *iVar6._M_current = ng;
        (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar6._M_current + 1;
      }
      bVar18 = (int)local_1a8 < iVar19;
      local_1a8 = local_1a8 + 1;
    } while (bVar18);
  }
  return;
}

Assistant:

IndexSpaceImp<G>::IndexSpaceImp (const G& gshop, const Geometry& geom,
                                 int required_coarsening_level,
                                 int max_coarsening_level,
                                 int ngrow, bool build_coarse_level_by_coarsening,
                                 bool extend_domain_face, int num_coarsen_opt)
    : m_gshop(gshop),
      m_build_coarse_level_by_coarsening(build_coarse_level_by_coarsening),
      m_extend_domain_face(extend_domain_face),
      m_num_coarsen_opt(num_coarsen_opt)
{
    // build finest level (i.e., level 0) first
    AMREX_ALWAYS_ASSERT(required_coarsening_level >= 0 && required_coarsening_level <= 30);
    max_coarsening_level = std::max(required_coarsening_level,max_coarsening_level);
    max_coarsening_level = std::min(30,max_coarsening_level);

    int ngrow_finest = std::max(ngrow,0);
    for (int i = 1; i <= required_coarsening_level; ++i) {
        ngrow_finest *= 2;
    }

    m_geom.push_back(geom);
    m_domain.push_back(geom.Domain());
    m_ngrow.push_back(ngrow_finest);
    m_gslevel.reserve(max_coarsening_level+1);
    m_gslevel.emplace_back(this, gshop, geom, EB2::max_grid_size, ngrow_finest, extend_domain_face,
                           num_coarsen_opt);

    for (int ilev = 1; ilev <= max_coarsening_level; ++ilev)
    {
        bool coarsenable = m_geom.back().Domain().coarsenable(2,2);
        if (!coarsenable) {
            if (ilev <= required_coarsening_level) {
                amrex::Abort("IndexSpaceImp: domain is not coarsenable at level "+std::to_string(ilev));
            } else {
                break;
            }
        }

        int ng = (ilev > required_coarsening_level) ? 0 : m_ngrow.back()/2;

        Box cdomain = amrex::coarsen(m_geom.back().Domain(),2);
        Geometry cgeom = amrex::coarsen(m_geom.back(),2);
        m_gslevel.emplace_back(this, ilev, EB2::max_grid_size, ng, cgeom, m_gslevel[ilev-1]);
        if (!m_gslevel.back().isOK()) {
            m_gslevel.pop_back();
            if (ilev <= required_coarsening_level) {
                if (build_coarse_level_by_coarsening) {
                    amrex::Abort("Failed to build required coarse EB level "+std::to_string(ilev));
                } else {
                    m_gslevel.emplace_back(this, gshop, cgeom, EB2::max_grid_size, ng, extend_domain_face,
                                           num_coarsen_opt-ilev);
                }
            } else {
                break;
            }
        }
        m_geom.push_back(cgeom);
        m_domain.push_back(cdomain);
        m_ngrow.push_back(ng);
    }
}